

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSmallDeterminant.cpp
# Opt level: O2

dgGoogol * Determinant3x3(dgGoogol *__return_storage_ptr__,dgGoogol (*matrix) [3])

{
  undefined8 *puVar1;
  dgGoogol *pdVar2;
  undefined8 uVar3;
  HaU64 HVar4;
  HaU64 HVar5;
  HaU64 HVar6;
  dgGoogol (*padVar7) [3];
  HaI32 j;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  dgGoogol sign;
  dgGoogol local_1a0;
  dgGoogol negOne;
  dgGoogol local_150;
  dgGoogol local_128;
  dgGoogol minorDet;
  dgGoogol cofactor [2] [2];
  
  dgGoogol::dgGoogol(&negOne,-1.0);
  dgGoogol::dgGoogol(&sign,-1.0);
  dgGoogol::dgGoogol(__return_storage_ptr__,0.0);
  lVar9 = 0;
  for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
    lVar11 = 0;
    do {
      dgGoogol::dgGoogol((dgGoogol *)((long)cofactor[0][0].m_mantissa + lVar11 + -8));
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0xa0);
    padVar7 = matrix;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      iVar10 = 0;
      for (lVar8 = 0; lVar8 != 0x78; lVar8 = lVar8 + 0x28) {
        if (lVar9 != lVar8) {
          cofactor[lVar11][iVar10].m_mantissa[3] =
               *(HaU64 *)((long)(*padVar7)[0].m_mantissa + lVar8 + 0x18);
          puVar1 = (undefined8 *)((long)(*padVar7)[0].m_mantissa + lVar8 + -8);
          uVar3 = *puVar1;
          HVar4 = puVar1[1];
          HVar5 = puVar1[2];
          HVar6 = puVar1[3];
          pdVar2 = cofactor[lVar11] + iVar10;
          pdVar2->m_sign = (char)uVar3;
          pdVar2->field_0x1 = (char)((ulong)uVar3 >> 8);
          pdVar2->m_exponent = (short)((ulong)uVar3 >> 0x10);
          *(int *)&pdVar2->field_0x4 = (int)((ulong)uVar3 >> 0x20);
          pdVar2->m_mantissa[0] = HVar4;
          pdVar2->m_mantissa[1] = HVar5;
          pdVar2->m_mantissa[2] = HVar6;
          iVar10 = iVar10 + 1;
        }
      }
      padVar7 = padVar7 + 1;
    }
    Determinant2x2(&minorDet,cofactor);
    dgGoogol::operator*(&local_150,&sign,&minorDet);
    dgGoogol::operator*(&local_128,&local_150,matrix[2] + lVar12);
    dgGoogol::operator+(&local_1a0,__return_storage_ptr__,&local_128);
    __return_storage_ptr__->m_mantissa[3] = local_1a0.m_mantissa[3];
    __return_storage_ptr__->m_sign = local_1a0.m_sign;
    __return_storage_ptr__->field_0x1 = local_1a0._1_1_;
    __return_storage_ptr__->m_exponent = local_1a0.m_exponent;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_1a0._4_4_;
    __return_storage_ptr__->m_mantissa[0] = local_1a0.m_mantissa[0];
    __return_storage_ptr__->m_mantissa[1] = local_1a0.m_mantissa[1];
    __return_storage_ptr__->m_mantissa[2] = local_1a0.m_mantissa[2];
    dgGoogol::~dgGoogol(&local_1a0);
    dgGoogol::~dgGoogol(&local_128);
    dgGoogol::~dgGoogol(&local_150);
    dgGoogol::operator*(&local_1a0,&sign,&negOne);
    sign.m_mantissa[3] = local_1a0.m_mantissa[3];
    sign.m_sign = local_1a0.m_sign;
    sign._1_1_ = local_1a0._1_1_;
    sign.m_exponent = local_1a0.m_exponent;
    sign._4_4_ = local_1a0._4_4_;
    sign.m_mantissa[0] = local_1a0.m_mantissa[0];
    sign.m_mantissa[1] = local_1a0.m_mantissa[1];
    sign.m_mantissa[2] = local_1a0.m_mantissa[2];
    dgGoogol::~dgGoogol(&local_1a0);
    dgGoogol::~dgGoogol(&minorDet);
    lVar11 = 0x78;
    do {
      dgGoogol::~dgGoogol((dgGoogol *)((long)cofactor[0][0].m_mantissa + lVar11 + -8));
      lVar11 = lVar11 + -0x28;
    } while (lVar11 != -0x28);
    lVar9 = lVar9 + 0x28;
  }
  dgGoogol::~dgGoogol(&sign);
  dgGoogol::~dgGoogol(&negOne);
  return __return_storage_ptr__;
}

Assistant:

dgGoogol Determinant3x3 (const dgGoogol matrix[3][3])
{
	dgGoogol negOne (hacd::HaF64 (-1.0f));
	dgGoogol sign (hacd::HaF64 (-1.0f));
	dgGoogol det = hacd::HaF64 (0.0f);
	for (hacd::HaI32 i = 0; i < 3; i ++)  {
		dgGoogol cofactor[2][2];

		for (hacd::HaI32 j = 0; j < 2; j ++) {
			hacd::HaI32 k0 = 0;
			for (hacd::HaI32 k = 0; k < 3; k ++) {
				if (k != i) {
					cofactor[j][k0] = matrix[j][k];
					k0 ++;
				}
			}
		}

		dgGoogol minorDet (Determinant2x2 (cofactor));
		det = det + sign * minorDet * matrix[2][i];
		sign = sign * negOne;
	}
	return det;
}